

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O0

void sun_prog_glasstower(AREA_DATA_conflict *area)

{
  char *in_stack_000023f8;
  AREA_DATA_conflict *in_stack_00002400;
  
  switch(sun) {
  case 0:
    zone_echo(in_stack_00002400,in_stack_000023f8);
    break;
  case 1:
    zone_echo(in_stack_00002400,in_stack_000023f8);
    break;
  case 2:
    zone_echo(in_stack_00002400,in_stack_000023f8);
    break;
  case 3:
    zone_echo(in_stack_00002400,in_stack_000023f8);
  }
  return;
}

Assistant:

void sun_prog_glasstower(AREA_DATA *area)
{
	switch (sun)
	{
		case (SolarPosition::Sunrise):
			zone_echo(area, "{RThe magical luminescence of the Tower fades, replaced by the ruddy hue of sunrise.{x");
			break;
		case (SolarPosition::Daylight):
			zone_echo(area, "{YBrilliant rays of light are shattered by the complex structures of glass as the sun illuminates the Tower.{x");
			break;
		case (SolarPosition::Sunset):
			zone_echo(area, "{MAs the sun begins to set, the Tower takes on the color of the dusky sky.{x");
			break;
		case (SolarPosition::Dark):
			zone_echo(area, "{WThe natural light now being insufficient, the Tower itself begins to glow with magical energy.{x");
			break;
	}
}